

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMixedHybridMeshControl::CreateSkeletonAxialFluxes(TPZMHMixedHybridMeshControl *this)

{
  long lVar1;
  TPZInterpolatedElement *pTVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  TPZInterpolatedElement **ppTVar6;
  pointer ppVar7;
  TPZGeoEl *pTVar8;
  TPZCompMesh *this_00;
  long in_RDI;
  int gelfluxmatid;
  TPZGeoEl *gelflux;
  int64_t elindex;
  TPZGeoElSide gelside;
  TPZGeoEl *gel_1;
  int pressmatid;
  TPZInterpolatedElement *press_1;
  iterator it;
  TPZGeoEl *gel;
  TPZInterpolatedElement *press;
  TPZCompEl *cel;
  int64_t el;
  TPZManVector<TPZInterpolatedElement_*,_10> pressureelements;
  int64_t nel;
  size_t in_stack_00000238;
  char *in_stack_00000240;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  TPZCompMesh *in_stack_fffffffffffffe20;
  TPZGeoMesh *in_stack_fffffffffffffe28;
  TPZGeoMesh *in_stack_fffffffffffffe30;
  TPZInterpolatedElement **in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  TPZManVector<TPZInterpolatedElement_*,_10> *in_stack_fffffffffffffe50;
  TPZInterpolatedElement *local_160;
  TPZCompEl *in_stack_fffffffffffffeb0;
  TPZCompMesh *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffee4;
  TPZSavable in_stack_fffffffffffffee8;
  TPZMHMixedHybridMeshControl *in_stack_fffffffffffffef0;
  iterator local_c8;
  iterator local_c0;
  TPZGeoEl *local_b8;
  TPZInterpolatedElement *local_b0;
  TPZCompEl *local_98;
  TPZGeoEl **local_90;
  TPZGeoEl **local_88;
  int *local_10;
  
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference(in_stack_fffffffffffffe30);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
  local_10 = (int *)TPZCompMesh::NElements((TPZCompMesh *)0x1e339c9);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::NElements((TPZGeoMesh *)0x1e339ea);
  local_88 = (TPZGeoEl **)0x0;
  TPZManVector<TPZInterpolatedElement_*,_10>::TPZManVector
            (in_stack_fffffffffffffe50,CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
             ,in_stack_fffffffffffffe40);
  for (local_90 = (TPZGeoEl **)0x0; (long)local_90 < (long)local_10;
      local_90 = (TPZGeoEl **)((long)local_90 + 1)) {
    in_stack_fffffffffffffeb8 =
         TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28));
    in_stack_fffffffffffffeb0 =
         TPZCompMesh::Element
                   (in_stack_fffffffffffffe20,
                    CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_98 = in_stack_fffffffffffffeb0;
    if (in_stack_fffffffffffffeb0 != (TPZCompEl *)0x0) {
      if (in_stack_fffffffffffffeb0 == (TPZCompEl *)0x0) {
        local_160 = (TPZInterpolatedElement *)0x0;
      }
      else {
        local_160 = (TPZInterpolatedElement *)
                    __dynamic_cast(in_stack_fffffffffffffeb0,&TPZCompEl::typeinfo,
                                   &TPZInterpolatedElement::typeinfo,0);
      }
      local_b0 = local_160;
      if (local_160 == (TPZInterpolatedElement *)0x0) {
        pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
      }
      local_b8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe28);
      pTVar2 = local_b0;
      iVar5 = TPZGeoEl::Index(local_b8);
      ppTVar6 = TPZVec<TPZInterpolatedElement_*>::operator[]
                          ((TPZVec<TPZInterpolatedElement_*> *)&stack0xffffffffffffff80,iVar5);
      *ppTVar6 = pTVar2;
    }
  }
  local_c0 = std::
             map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
             ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  while( true ) {
    local_c8 = std::
               map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
               ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    bVar3 = std::operator!=(&stack0xffffffffffffff40,&stack0xffffffffffffff38);
    if (!bVar3) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1e33c08);
    lVar1 = ppVar7->first;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1e33c1d);
    if (lVar1 != (ppVar7->second).second) {
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                          0x1e33c3d);
      ppTVar6 = TPZVec<TPZInterpolatedElement_*>::operator[]
                          ((TPZVec<TPZInterpolatedElement_*> *)&stack0xffffffffffffff80,
                           ppVar7->first);
      if (*ppTVar6 != (TPZInterpolatedElement *)0x0) {
        pTVar8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe28);
        iVar4 = TPZGeoEl::MaterialId(pTVar8);
        TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
        std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1e33cc8);
        pTVar8 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffe20,
                                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        (**(code **)(*(long *)pTVar8 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffe30,(TPZGeoEl *)in_stack_fffffffffffffe28,
                   (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        in_stack_fffffffffffffe30 = (TPZGeoMesh *)&stack0xfffffffffffffee8;
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffe20,
                   (TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        iVar5 = HasNeighbour((TPZGeoElSide *)in_stack_fffffffffffffeb8,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)
                             in_stack_fffffffffffffeb0);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e33d82);
        if ((iVar4 == *(int *)(in_RDI + 0x270)) && (iVar5 == -1)) {
          pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
        }
        if (iVar5 == -1) {
          in_stack_fffffffffffffee4 = 7;
        }
        else {
          in_stack_fffffffffffffe28 =
               TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
          this_00 = (TPZCompMesh *)
                    TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffe20,
                                        CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18
                                                ));
          in_stack_fffffffffffffe20 = this_00;
          in_stack_fffffffffffffe1c = TPZGeoEl::MaterialId((TPZGeoEl *)this_00);
          TPZGeoEl::SetMaterialId((TPZGeoEl *)this_00,*(int *)(in_RDI + 0x38));
          CreateAxialFluxElement
                    (in_stack_fffffffffffffef0,
                     (TPZInterpolatedElement *)in_stack_fffffffffffffee8._vptr_TPZSavable,
                     in_stack_fffffffffffffee4);
          in_stack_fffffffffffffee4 = 0;
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e33ebf);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
               in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  }
  TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector
            ((TPZManVector<TPZInterpolatedElement_*,_10> *)in_stack_fffffffffffffe20);
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::CreateSkeletonAxialFluxes()
{
    fGMesh->ResetReference();
    // create a vector that points a geometric element index to a pressure computational element
    int64_t nel = fPressureFineMesh->NElements();
    TPZManVector<TPZInterpolatedElement *> pressureelements(fGMesh->NElements(),0);
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        if (!cel) {
            continue;
        }
        TPZInterpolatedElement *press = dynamic_cast<TPZInterpolatedElement *>(cel);
        if(!press) DebugStop();
#ifdef PZDEBUG
        if (!cel->Reference()) {
            DebugStop();
        }
#endif
        TPZGeoEl *gel = cel->Reference();
        pressureelements[gel->Index()] = press;
    }
    /// indices of the skeleton elements and their left/right geometric elements of the skeleton mesh
//    std::map<int64_t, std::pair<int64_t,int64_t> > fInterfaces;
    for (auto it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        TPZInterpolatedElement *press = pressureelements[it->first];
        if (!press) {
            continue;
        }
        int pressmatid = press->Reference()->MaterialId();
        TPZGeoEl *gel = fGMesh->Element(it->first);
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        int64_t elindex = -1;
        elindex = HasNeighbour(gelside, fSkeletonWithFlowMatId);
        if (pressmatid == fSkeletonWithFlowPressureMatId && elindex == -1) {
            DebugStop();
        }
        if (elindex == -1) {
            continue;
        }
        TPZGeoEl *gelflux = fGMesh->Element(elindex);
        int gelfluxmatid = gelflux->MaterialId();
#ifdef PZDEBUG
        {
            // if two fracture flow elements would be created, an error in the datastructure occurred
            TPZGeoEl *gel = fGMesh->Element(it->first);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            if (HasNeighbour(gelside, fFractureFlowDim1MatId) != -1) {
                DebugStop();
            }
        }
#endif
        gelflux->SetMaterialId(fSkeletonMatId);
        CreateAxialFluxElement(press, gelfluxmatid);
    }
}